

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printConditional(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  Ref local_28;
  Ref node_local;
  
  local_28.inst = node.inst;
  pRVar1 = Ref::operator[](&local_28,1);
  printChild(this,pRVar1->inst,local_28,-1);
  space(this);
  emit(this,'?');
  space(this);
  pRVar1 = Ref::operator[](&local_28,2);
  printChild(this,pRVar1->inst,local_28,0);
  space(this);
  emit(this,':');
  space(this);
  pRVar1 = Ref::operator[](&local_28,3);
  printChild(this,pRVar1->inst,local_28,1);
  return;
}

Assistant:

void printConditional(Ref node) {
    printChild(node[1], node, -1);
    space();
    emit('?');
    space();
    printChild(node[2], node, 0);
    space();
    emit(':');
    space();
    printChild(node[3], node, 1);
  }